

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

void __thiscall llvm::raw_null_ostream::~raw_null_ostream(raw_null_ostream *this)

{
  ~raw_null_ostream(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

raw_null_ostream::~raw_null_ostream() {
#ifndef NDEBUG
  // ~raw_ostream asserts that the buffer is empty. This isn't necessary
  // with raw_null_ostream, but it's better to have raw_null_ostream follow
  // the rules than to change the rules just for raw_null_ostream.
  flush();
#endif
}